

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall arangodb::velocypack::Parser::parseString(Parser *this)

{
  ValueLength *pVVar1;
  ValueLength VVar2;
  uint8_t *puVar3;
  ExceptionType EVar4;
  bool bVar5;
  byte value;
  uint uVar6;
  int iVar7;
  undefined **ppuVar8;
  long lVar9;
  Exception *this_00;
  int iVar10;
  char *msg;
  Builder *pBVar11;
  int iVar12;
  uint uVar13;
  byte bVar14;
  ulong uVar15;
  bool bVar16;
  
  VVar2 = this->_builderPtr->_pos;
  Builder::appendByte(this->_builderPtr,'@');
  bVar5 = false;
  uVar13 = 0;
LAB_001106bf:
  uVar15 = this->_size - this->_pos;
  if (0xf < uVar15) {
    Builder::reserve(this->_builderPtr,uVar15);
    ppuVar8 = &JSONStringCopy;
    if (this->options->validateUtf8Strings != false) {
      ppuVar8 = &JSONStringCopyCheckUtf8;
    }
    lVar9 = (*(code *)*ppuVar8)(this->_builderPtr->_start + this->_builderPtr->_pos,
                                this->_start + this->_pos,uVar15 - 0xf);
    this->_pos = this->_pos + lVar9;
    pBVar11 = this->_builderPtr;
    pVVar1 = &pBVar11->_pos;
    *pVVar1 = *pVVar1 + lVar9;
    pVVar1 = &pBVar11->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + lVar9;
  }
  uVar6 = getOneOrThrow(this,"Unfinished string");
  if ((!bVar5) && (0x7e < this->_builderPtr->_pos - (VVar2 + 1))) {
    Builder::reserve(this->_builderPtr,8);
    puVar3 = this->_builderPtr->_start;
    memmove(puVar3 + VVar2 + 9,puVar3 + VVar2 + 1,this->_builderPtr->_pos - (VVar2 + 1));
    pBVar11 = this->_builderPtr;
    pVVar1 = &pBVar11->_pos;
    *pVVar1 = *pVVar1 + 8;
    pVVar1 = &pBVar11->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + 8;
    bVar5 = true;
  }
  if (uVar6 != 0x5c) {
    if (uVar6 == 0x22) {
      pBVar11 = this->_builderPtr;
      if (bVar5) {
        uVar15 = (pBVar11->_pos - VVar2) - 9;
        pBVar11->_start[VVar2] = 0xbf;
        for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
          this->_builderPtr->_start[lVar9 + 1 + VVar2] = (uint8_t)uVar15;
          uVar15 = uVar15 >> 8;
        }
      }
      else {
        pBVar11->_start[VVar2] = (char)pBVar11->_pos + ~(byte)VVar2 + '@';
      }
      if ((this->options->validateUtf8Strings != true) || (uVar13 == 0)) {
        return;
      }
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Unexpected end of string after high surrogate";
      goto LAB_00110bb3;
    }
    bVar14 = (byte)uVar6;
    if ((char)bVar14 < '\0') {
      if (this->options->validateUtf8Strings == false) goto LAB_001108b2;
      iVar12 = 1;
      if (((bVar14 & 0xe0) == 0xc0) ||
         (((uVar6 & 0xe0) != 0x80 &&
          ((iVar12 = 2, (uVar6 & 0xf0) == 0xe0 || (iVar12 = 3, (uVar6 & 0xf8) == 0xf0)))))) {
        Builder::reserve(this->_builderPtr,(ulong)(iVar12 + 1));
        pBVar11 = this->_builderPtr;
        while( true ) {
          Builder::appendByteUnchecked(pBVar11,(uint8_t)uVar6);
          bVar16 = iVar12 == 0;
          iVar12 = iVar12 + -1;
          if (bVar16) break;
          uVar6 = getOneOrThrow(this,"scanString: truncated UTF-8 sequence");
          if ((uVar6 & 0xc0) != 0x80) goto LAB_00110c16;
          pBVar11 = this->_builderPtr;
        }
        goto LAB_0011094a;
      }
LAB_00110c16:
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      EVar4 = InvalidUtf8Sequence;
    }
    else {
      if (0x1f < (int)uVar6) {
LAB_001108b2:
        pBVar11 = this->_builderPtr;
        goto LAB_00110945;
      }
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      EVar4 = UnexpectedControlCharacter;
    }
    Exception::Exception(this_00,EVar4);
    goto LAB_00110bd4;
  }
  iVar12 = consume(this);
  if (iVar12 < 0) {
switchD_001108cd_caseD_6f:
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Invalid escape sequence";
LAB_00110bc9:
    EVar4 = ParseError;
    goto LAB_00110bcb;
  }
  switch(iVar12) {
  case 0x6e:
    pBVar11 = this->_builderPtr;
    bVar14 = 10;
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
    goto switchD_001108cd_caseD_6f;
  case 0x72:
    pBVar11 = this->_builderPtr;
    bVar14 = 0xd;
    break;
  case 0x74:
    pBVar11 = this->_builderPtr;
    bVar14 = 9;
    break;
  case 0x75:
    uVar6 = 0;
    iVar12 = 4;
    while (bVar16 = iVar12 != 0, iVar12 = iVar12 + -1, bVar16) {
      iVar7 = consume(this);
      if (iVar7 < 0) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        msg = "Unfinished \\uXXXX escape sequence";
        goto LAB_00110bc9;
      }
      iVar10 = -0x30;
      if (((9 < iVar7 - 0x30U) && (iVar10 = -0x57, 5 < iVar7 - 0x61U)) &&
         (iVar10 = -0x37, 5 < iVar7 - 0x41U)) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        msg = "Illegal \\uXXXX escape sequence character";
        goto LAB_00110bc9;
      }
      uVar6 = uVar6 * 0x10 + iVar10 + iVar7;
    }
    bVar14 = (byte)uVar6;
    if (uVar6 < 0x80) {
      Builder::appendByte(this->_builderPtr,bVar14);
    }
    else if (uVar6 < 0x800) {
      Builder::reserve(this->_builderPtr,2);
      pBVar11 = this->_builderPtr;
      value = (byte)(uVar6 >> 6) | 0xc0;
LAB_00110a33:
      Builder::appendByteUnchecked(pBVar11,value);
      Builder::appendByteUnchecked(this->_builderPtr,bVar14 & 0x3f | 0x80);
    }
    else if ((uVar6 & 0xfffffc00) == 0xd800) {
      if (uVar13 == 0) {
        Builder::reserve(this->_builderPtr,3);
        Builder::appendByteUnchecked(this->_builderPtr,0xed);
        Builder::appendByteUnchecked(this->_builderPtr,(byte)(uVar6 >> 6) & 0x2f | 0x80);
        Builder::appendByteUnchecked(this->_builderPtr,bVar14 & 0x3f | 0x80);
        uVar13 = uVar6;
        goto LAB_001106bf;
      }
      if (this->options->validateUtf8Strings == true) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        msg = "Unexpected \\uXXXX escape sequence (multiple adjacent high surrogates)";
        goto LAB_00110bb3;
      }
    }
    else {
      if ((uVar6 & 0xfffffc00) != 0xdc00) {
        Builder::reserve(this->_builderPtr,3);
        Builder::appendByteUnchecked(this->_builderPtr,(char)(uVar6 >> 0xc) + 0xe0);
        pBVar11 = this->_builderPtr;
        value = (byte)(uVar6 >> 6) & 0x3f | 0x80;
        goto LAB_00110a33;
      }
      if (uVar13 == 0) {
        uVar13 = 0;
        if (this->options->validateUtf8Strings != true) goto LAB_0011094a;
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        msg = "Unexpected \\uXXXX escape sequence (low surrogate without high surrogate)";
        goto LAB_00110bb3;
      }
      uVar13 = uVar13 * 0x400 + uVar6 + 0xfca02400;
      pBVar11 = this->_builderPtr;
      pBVar11->_pos = pBVar11->_pos - 3;
      pVVar1 = &pBVar11->_bufferPtr->_size;
      *pVVar1 = *pVVar1 - 3;
      Builder::reserve(pBVar11,4);
      Builder::appendByteUnchecked(this->_builderPtr,(char)(uVar13 >> 0x12) + 0xf0);
      Builder::appendByteUnchecked(this->_builderPtr,(byte)(uVar13 >> 0xc) & 0x3f | 0x80);
      Builder::appendByteUnchecked(this->_builderPtr,(byte)(uVar13 >> 6) & 0x3f | 0x80);
      Builder::appendByteUnchecked(this->_builderPtr,bVar14 & 0x3f | 0x80);
      uVar13 = 0;
    }
LAB_0011094a:
    if ((this->options->validateUtf8Strings == true) && (uVar13 != 0)) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Unexpected \\uXXXX escape sequence (high surrogate without low surrogate)";
LAB_00110bb3:
      EVar4 = InvalidUtf8Sequence;
LAB_00110bcb:
      Exception::Exception(this_00,EVar4,msg);
LAB_00110bd4:
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
    goto LAB_001106bf;
  default:
    if (((iVar12 == 0x22) || (iVar12 == 0x2f)) || (iVar12 == 0x5c)) {
      pBVar11 = this->_builderPtr;
      bVar14 = (byte)iVar12;
    }
    else if (iVar12 == 0x62) {
      pBVar11 = this->_builderPtr;
      bVar14 = 8;
    }
    else {
      if (iVar12 != 0x66) goto switchD_001108cd_caseD_6f;
      pBVar11 = this->_builderPtr;
      bVar14 = 0xc;
    }
  }
LAB_00110945:
  Builder::appendByte(pBVar11,bVar14);
  goto LAB_0011094a;
}

Assistant:

void Parser::parseString() {
  // When we get here, we have seen a " character and now want to
  // find the end of the string and parse the string value to its
  // VPack representation. We assume that the string is short and
  // insert 8 bytes for the length as soon as we reach 127 bytes
  // in the VPack representation.
  ValueLength const base = _builderPtr->_pos;
  _builderPtr->appendByte(0x40);  // correct this later

  bool large = false;          // set to true when we reach 128 bytes
  uint32_t highSurrogate = 0;  // non-zero if high-surrogate was seen

  while (true) {
    std::size_t remainder = _size - _pos;
    if (remainder >= 16) {
      _builderPtr->reserve(remainder);
      std::size_t count;
      // Note that the SSE4.2 accelerated string copying functions might
      // peek up to 15 bytes over the given end, because they use 128bit
      // registers. Therefore, we have to subtract 15 from remainder
      // to be on the safe side. Further bytes will be processed below.
      if (options->validateUtf8Strings) {
        count = JSONStringCopyCheckUtf8(_builderPtr->_start + _builderPtr->_pos,
                                        _start + _pos, remainder - 15);
      } else {
        count = JSONStringCopy(_builderPtr->_start + _builderPtr->_pos,
                               _start + _pos, remainder - 15);
      }
      _pos += count;
      _builderPtr->advance(count);
    }
    int i = getOneOrThrow("Unfinished string");
    if (!large && _builderPtr->_pos - (base + 1) > 126) {
      large = true;
      _builderPtr->reserve(8);
      ValueLength len = _builderPtr->_pos - (base + 1);
      memmove(_builderPtr->_start + base + 9, _builderPtr->_start + base + 1,
              checkOverflow(len));
      _builderPtr->advance(8);
    }
    
    switch (i) {
      case '"':
        ValueLength len;
        if (!large) {
          len = _builderPtr->_pos - (base + 1);
          _builderPtr->_start[base] = 0x40 + static_cast<uint8_t>(len);
          // String is ready
        } else {
          len = _builderPtr->_pos - (base + 9);
          _builderPtr->_start[base] = 0xbf;
          for (ValueLength i = 1; i <= 8; i++) {
            _builderPtr->_start[base + i] = len & 0xff;
            len >>= 8;
          }
        }
        if (VELOCYPACK_UNLIKELY(options->validateUtf8Strings && highSurrogate != 0)) {
          throw Exception(Exception::InvalidUtf8Sequence,
                              "Unexpected end of string after high surrogate");
        }
        return;
      case '\\':
        // Handle cases or throw error
        i = consume();
        if (VELOCYPACK_UNLIKELY(i < 0)) {
          throw Exception(Exception::ParseError, "Invalid escape sequence");
        }
        switch (i) {
          case '"':
          case '/':
          case '\\':
            _builderPtr->appendByte(static_cast<uint8_t>(i));
            break;
          case 'b':
            _builderPtr->appendByte('\b');
            break;
          case 'f':
            _builderPtr->appendByte('\f');
            break;
          case 'n':
            _builderPtr->appendByte('\n');
            break;
          case 'r':
            _builderPtr->appendByte('\r');
            break;
          case 't':
            _builderPtr->appendByte('\t');
            break;
          case 'u': {
            uint32_t v = 0;
            for (int j = 0; j < 4; j++) {
              i = consume();
              if (i < 0) {
                throw Exception(Exception::ParseError,
                                "Unfinished \\uXXXX escape sequence");
              }
              if (i >= '0' && i <= '9') {
                v = (v << 4) + i - '0';
              } else if (i >= 'a' && i <= 'f') {
                v = (v << 4) + i - 'a' + 10;
              } else if (i >= 'A' && i <= 'F') {
                v = (v << 4) + i - 'A' + 10;
              } else {
                throw Exception(Exception::ParseError,
                                "Illegal \\uXXXX escape sequence character");
              }
            }
            if (v < 0x80) {
              _builderPtr->appendByte(static_cast<uint8_t>(v));
            } else if (v < 0x800) {
              _builderPtr->reserve(2);
              _builderPtr->appendByteUnchecked(0xc0 + (v >> 6));
              _builderPtr->appendByteUnchecked(0x80 + (v & 0x3f));
            } else if (v >= 0xdc00 && v < 0xe000) {
              if (highSurrogate != 0) {
                // Low surrogate, put the two together:
                v = 0x10000 + ((highSurrogate - 0xd800) << 10) + v - 0xdc00;
                _builderPtr->rollback(3);
                _builderPtr->reserve(4);
                _builderPtr->appendByteUnchecked(0xf0 + (v >> 18));
                _builderPtr->appendByteUnchecked(0x80 + ((v >> 12) & 0x3f));
                _builderPtr->appendByteUnchecked(0x80 + ((v >> 6) & 0x3f));
                _builderPtr->appendByteUnchecked(0x80 + (v & 0x3f));
                highSurrogate = 0;
              } else if (options->validateUtf8Strings) {
                // Low surrogate without a high surrogate first
                throw Exception(Exception::InvalidUtf8Sequence,
                                "Unexpected \\uXXXX escape sequence (low surrogate without high surrogate)");
              }
            } else if (v >= 0xd800 && v < 0xdc00) {
              if (highSurrogate == 0) {
                // High surrogate:
                highSurrogate = v;
                _builderPtr->reserve(3);
                _builderPtr->appendByteUnchecked(0xe0 + (v >> 12));
                _builderPtr->appendByteUnchecked(0x80 + ((v >> 6) & 0x3f));
                _builderPtr->appendByteUnchecked(0x80 + (v & 0x3f));

                continue;
              } else if (options->validateUtf8Strings) {
                throw Exception(Exception::InvalidUtf8Sequence,
                                "Unexpected \\uXXXX escape sequence (multiple adjacent high surrogates)");
              }
            } else {
              _builderPtr->reserve(3);
              _builderPtr->appendByteUnchecked(0xe0 + (v >> 12));
              _builderPtr->appendByteUnchecked(0x80 + ((v >> 6) & 0x3f));
              _builderPtr->appendByteUnchecked(0x80 + (v & 0x3f));
            }
            break;
          }
          default:
            throw Exception(Exception::ParseError, "Invalid escape sequence");
        }
        break;
      default:
        if ((i & 0x80) == 0) {
          // non-UTF-8 sequence
          if (VELOCYPACK_UNLIKELY(i < 0x20)) {
            // control character
            throw Exception(Exception::UnexpectedControlCharacter);
          }
          _builderPtr->appendByte(static_cast<uint8_t>(i));
        } else {
          if (!options->validateUtf8Strings) {
            _builderPtr->appendByte(static_cast<uint8_t>(i));
          } else {
            // multi-byte UTF-8 sequence!
            int follow = 0;
            if ((i & 0xe0) == 0x80) {
              throw Exception(Exception::InvalidUtf8Sequence);
            } else if ((i & 0xe0) == 0xc0) {
              // two-byte sequence
              follow = 1;
            } else if ((i & 0xf0) == 0xe0) {
              // three-byte sequence
              follow = 2;
            } else if ((i & 0xf8) == 0xf0) {
              // four-byte sequence
              follow = 3;
            } else {
              throw Exception(Exception::InvalidUtf8Sequence);
            }

            // validate follow up characters
            _builderPtr->reserve(1 + follow);
            _builderPtr->appendByteUnchecked(static_cast<uint8_t>(i));
            for (int j = 0; j < follow; ++j) {
              i = getOneOrThrow("scanString: truncated UTF-8 sequence");
              if ((i & 0xc0) != 0x80) {
                throw Exception(Exception::InvalidUtf8Sequence);
              }
              _builderPtr->appendByteUnchecked(static_cast<uint8_t>(i));
            }
          }
        }
        break;
    }

    if (VELOCYPACK_UNLIKELY(options->validateUtf8Strings && highSurrogate != 0)) {
      throw Exception(Exception::InvalidUtf8Sequence,
                      "Unexpected \\uXXXX escape sequence (high surrogate without low surrogate)");
    }
  }
}